

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  byte bVar9;
  u32 uVar10;
  bool bVar11;
  u8 *puVar12;
  u32 uVar13;
  ulong uVar14;
  byte *pbVar15;
  long in_FS_OFFSET;
  bool bVar16;
  u8 *local_58;
  byte *local_50;
  u8 *local_48;
  char local_3b;
  uchar local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = pInfo->matchOne;
  uVar7 = (uint)bVar9;
  bVar1 = pInfo->matchAll;
  uVar2 = pInfo->noCase;
  local_58 = (u8 *)0x0;
  local_50 = zString;
  local_48 = zPattern;
LAB_001289f9:
  do {
    uVar13 = (u32)(char)*local_48;
    if ((char)*local_48 < '\0') {
      uVar13 = sqlite3Utf8Read(&local_48);
    }
    else {
      local_48 = local_48 + 1;
    }
    if (uVar13 == 0) {
      uVar6 = (uint)(*local_50 != 0);
      goto LAB_00128dbb;
    }
    if (uVar13 == bVar1) {
      goto LAB_00128be6;
    }
    if (uVar13 == matchOther) {
      if (pInfo->matchSet == '\0') {
        uVar13 = sqlite3Utf8Read(&local_48);
        if (uVar13 != 0) {
          local_58 = local_48;
          goto LAB_00128ac8;
        }
        uVar6 = 1;
      }
      else {
        uVar13 = sqlite3Utf8Read(&local_50);
        uVar6 = 1;
        if (uVar13 != 0) {
          uVar4 = sqlite3Utf8Read(&local_48);
          uVar10 = 0;
          bVar16 = uVar4 == 0x5e;
          if (bVar16) {
            uVar4 = sqlite3Utf8Read(&local_48);
          }
          bVar11 = false;
          if (uVar4 != 0x5d) goto LAB_00128b5e;
          bVar11 = uVar13 == 0x5d;
LAB_00128b50:
          uVar10 = 0;
LAB_00128b52:
          uVar4 = sqlite3Utf8Read(&local_48);
LAB_00128b5e:
          if (uVar4 == 0x2d) {
            if ((*local_48 != ']') && (uVar10 != 0 && *local_48 != '\0')) goto code_r0x00128b9c;
          }
          else {
            if (uVar4 == 0x5d) {
              if (bVar11 == bVar16) goto LAB_00128dbb;
              goto LAB_001289f9;
            }
            if (uVar4 == 0) goto LAB_00128dbb;
          }
          uVar10 = uVar4;
          if (uVar13 == uVar4) {
            bVar11 = true;
          }
          goto LAB_00128b52;
        }
      }
      goto LAB_00128dbb;
    }
LAB_00128ac8:
    uVar5 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar5 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (((uVar13 != uVar5) &&
        (((uVar2 == '\0' || (0x7f < (uVar5 | uVar13))) || (""[uVar13 & 0xff] != ""[uVar5 & 0xff]))))
       && (((uVar6 = 1, uVar13 != uVar7 || (uVar5 == 0)) || (local_48 == local_58))))
    goto LAB_00128dbb;
  } while( true );
  while( true ) {
    if (bVar9 < 0xc0) {
      bVar9 = pbVar15[1];
    }
    else {
      bVar9 = pbVar15[1];
    }
    pbVar15 = pbVar15 + 1;
    uVar6 = 2;
    if (bVar9 == 0) break;
LAB_00128c76:
    uVar6 = patternCompare(puVar12,pbVar15,pInfo,matchOther);
    if (uVar6 != 1) break;
  }
  goto LAB_00128dbb;
  while ((uVar7 != uVar5 || (uVar6 = patternCompare(puVar12,local_50,pInfo,matchOther), uVar6 == 1))
        ) {
LAB_00128d19:
    uVar7 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar7 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (uVar7 == 0) goto LAB_00128c34;
  }
  goto LAB_00128dbb;
  while( true ) {
    pbVar15 = pbVar15 + sVar8 + 1;
    uVar6 = patternCompare(puVar12,pbVar15,pInfo,matchOther);
    if (uVar6 != 1) break;
LAB_00128d7d:
    sVar8 = strcspn((char *)pbVar15,&local_3b);
    if (pbVar15[sVar8] == 0) goto LAB_00128c34;
  }
  goto LAB_00128dbb;
code_r0x00128b9c:
  uVar4 = sqlite3Utf8Read(&local_48);
  bVar3 = true;
  if (uVar4 < uVar13) {
    bVar3 = bVar11;
  }
  if (uVar10 <= uVar13) {
    bVar11 = bVar3;
  }
  goto LAB_00128b50;
  while ((uVar5 != uVar7 || (uVar13 = sqlite3Utf8Read(&local_50), uVar13 != 0))) {
LAB_00128be6:
    uVar5 = (uint)(char)*local_48;
    if ((int)uVar5 < 0) {
      uVar5 = sqlite3Utf8Read(&local_48);
    }
    else {
      local_48 = local_48 + 1;
    }
    if ((uVar5 != bVar1) && (bVar9 == 0 || uVar5 != uVar7)) {
      if (uVar5 == 0) {
        uVar6 = 0;
        goto LAB_00128dbb;
      }
      if (uVar5 == matchOther) {
        if (pInfo->matchSet != '\0') {
          bVar9 = *local_50;
          uVar6 = 2;
          if (bVar9 == 0) goto LAB_00128dbb;
          puVar12 = local_48 + -1;
          pbVar15 = local_50;
          goto LAB_00128c76;
        }
        uVar5 = sqlite3Utf8Read(&local_48);
        if (uVar5 == 0) break;
      }
      puVar12 = local_48;
      uVar14 = (ulong)uVar5;
      if (0x7f < uVar5) {
        goto LAB_00128d19;
      }
      local_39 = 0xaa;
      if (uVar2 == '\0') {
        local_3a = '\0';
      }
      else {
        local_3a = ""[uVar14];
        local_39 = 0;
        uVar14 = (ulong)(byte)((byte)uVar5 & (~""[uVar14] | 0xdf));
      }
      local_3b = (char)uVar14;
      pbVar15 = local_50;
      goto LAB_00128d7d;
    }
  }
LAB_00128c34:
  uVar6 = 2;
LAB_00128dbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}